

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::BlockRequested
          (PeerManagerImpl *this,NodeId nodeid,CBlockIndex *block,iterator **pit)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  CNodeState *pCVar5;
  PartiallyDownloadedBlock *this_00;
  _Base_ptr p_Var6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar7;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var8;
  _Base_ptr *pp_Var9;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var10;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var11;
  long in_FS_OFFSET;
  optional<long> from_peer;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar12;
  _Head_base<0UL,_PartiallyDownloadedBlock_*,_false> _Stack_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockIndex::GetBlockHash((uint256 *)local_58,block);
  pCVar5 = State(this,nodeid);
  if (pCVar5 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                  ,0x54a,
                  "bool (anonymous namespace)::PeerManagerImpl::BlockRequested(NodeId, const CBlockIndex &, std::list<QueuedBlock>::iterator **)"
                 );
  }
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::count(&this->mapBlocksInFlight,(key_type *)local_58);
  pVar12 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range(&this->mapBlocksInFlight,(key_type *)local_58);
  _Var10 = pVar12.second._M_node;
  while (_Var11 = pVar12.first._M_node, _Var11._M_node != _Var10._M_node) {
    _Var8._M_node = _Var11._M_node;
    if (*(long *)(_Var11._M_node + 2) == nodeid) goto joined_r0x001af125;
    pVar12 = (pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              )std::_Rb_tree_increment((_Rb_tree_node_base *)_Var11._M_node);
  }
  from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = 1;
  from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = nodeid;
  RemoveBlockRequest(this,(uint256 *)local_58,from_peer);
  if (pit == (iterator **)0x0) {
    this_00 = (PartiallyDownloadedBlock *)0x0;
  }
  else {
    this_00 = (PartiallyDownloadedBlock *)operator_new(0xa8);
    PartiallyDownloadedBlock::PartiallyDownloadedBlock(this_00,this->m_mempool);
  }
  _Stack_70._M_head_impl = this_00;
  p_Var6 = (_Base_ptr)operator_new(0x20);
  p_Var6->_M_left = (_Base_ptr)block;
  p_Var6->_M_right = (_Base_ptr)this_00;
  _Stack_70._M_head_impl = (PartiallyDownloadedBlock *)0x0;
  std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var6);
  psVar1 = &(pCVar5->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>::
  ~unique_ptr((unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
               *)&_Stack_70);
  if ((pCVar5->vBlocksInFlight).
      super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
      ._M_impl._M_node._M_size == 1) {
    tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                      ();
    (pCVar5->m_downloading_since).__r = (rep)tVar7.__d.__r;
    this->m_peers_downloading_from = this->m_peers_downloading_from + 1;
  }
  local_68 = local_48;
  p_Stack_60 = p_Stack_40;
  _Stack_70._M_head_impl = (PartiallyDownloadedBlock *)local_58._8_8_;
  _Var8._M_node = (_Base_ptr)operator_new(0x50);
  *(undefined8 *)(_Var8._M_node + 1) = local_58._0_8_;
  _Var8._M_node[1]._M_parent = (_Base_ptr)_Stack_70._M_head_impl;
  _Var8._M_node[1]._M_left = local_68;
  _Var8._M_node[1]._M_right = p_Stack_60;
  *(NodeId *)(_Var8._M_node + 2) = nodeid;
  _Var8._M_node[2]._M_parent = p_Var6;
  p_Var2 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header;
  pp_Var9 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var2->_M_header;
  while (p_Var3 = *pp_Var9, p_Var3 != (_Base_ptr)0x0) {
    bVar4 = ::operator<((base_blob<256U> *)(_Var8._M_node + 1),(base_blob<256U> *)(p_Var3 + 1));
    p_Var6 = p_Var3;
    pp_Var9 = &p_Var3->_M_left + !bVar4;
  }
  if (p_Var2 == (_Rb_tree_header *)p_Var6) {
    bVar4 = true;
  }
  else {
    bVar4 = ::operator<((base_blob<256U> *)(_Var8._M_node + 1),(base_blob<256U> *)(p_Var6 + 1));
  }
  std::_Rb_tree_insert_and_rebalance
            (bVar4,(_Rb_tree_node_base *)_Var8._M_node,(_Rb_tree_node_base *)p_Var6,
             (_Rb_tree_node_base *)p_Var2);
  psVar1 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar1 = *psVar1 + 1;
joined_r0x001af125:
  if (pit != (iterator **)0x0) {
    *pit = (iterator *)&_Var8._M_node[2]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return _Var11._M_node == _Var10._M_node;
}

Assistant:

bool PeerManagerImpl::BlockRequested(NodeId nodeid, const CBlockIndex& block, std::list<QueuedBlock>::iterator** pit)
{
    const uint256& hash{block.GetBlockHash()};

    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    // Short-circuit most stuff in case it is from the same node
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        if (range.first->second.first == nodeid) {
            if (pit) {
                *pit = &range.first->second.second;
            }
            return false;
        }
    }

    // Make sure it's not being fetched already from same peer.
    RemoveBlockRequest(hash, nodeid);

    std::list<QueuedBlock>::iterator it = state->vBlocksInFlight.insert(state->vBlocksInFlight.end(),
            {&block, std::unique_ptr<PartiallyDownloadedBlock>(pit ? new PartiallyDownloadedBlock(&m_mempool) : nullptr)});
    if (state->vBlocksInFlight.size() == 1) {
        // We're starting a block download (batch) from this peer.
        state->m_downloading_since = GetTime<std::chrono::microseconds>();
        m_peers_downloading_from++;
    }
    auto itInFlight = mapBlocksInFlight.insert(std::make_pair(hash, std::make_pair(nodeid, it)));
    if (pit) {
        *pit = &itInFlight->second.second;
    }
    return true;
}